

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O2

bool __thiscall
ON_ArchivableDictionaryPrivate::TryGetValue<ON_SimpleArray<int>>
          (ON_ArchivableDictionaryPrivate *this,wchar_t *key,ON_SimpleArray<int> *value)

{
  _Base_ptr p_Var1;
  int iVar2;
  const_iterator cVar3;
  wchar_t *local_18;
  
  local_18 = key;
  cVar3 = std::
          _Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
          ::_M_find_tr<wchar_t_const*,void>
                    ((_Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
                      *)&this->m_map,&local_18);
  if ((_Rb_tree_header *)cVar3._M_node != &(this->m_map)._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = cVar3._M_node[1]._M_parent;
    iVar2 = (**(code **)(*(long *)p_Var1 + 0x10))(p_Var1);
    if (iVar2 == 0x11) {
      ON_SimpleArray<int>::operator=(value,(ON_SimpleArray<int> *)&p_Var1->_M_parent);
      return true;
    }
  }
  return false;
}

Assistant:

bool TryGetValue(const wchar_t* key, T& value) const
  {
    const auto iterator = m_map.find(key);
    if (iterator == m_map.end()) return false;

    const auto entry = iterator->second.get();
    if (entry->EntryType() != Entry<T>::Type)
      return false;

    value = static_cast<const Entry<T>*>(entry)->Value();
    return true;
  }